

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O2

void Dar_ObjCutPrint(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  Dar_Cut_t *pCut;
  
  printf("Cuts for node %d:\n",(ulong)(uint)pObj->Id);
  pCut = (Dar_Cut_t *)(pObj->field_5).pData;
  for (uVar1 = 0; uVar1 < (byte)pObj->field_0x1f; uVar1 = uVar1 + 1) {
    if ((pCut->field_0x7 & 0x10) != 0) {
      Dar_CutPrint(pCut);
    }
    pCut = pCut + 1;
  }
  return;
}

Assistant:

void Dar_ObjCutPrint( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Dar_Cut_t * pCut;
    int i;
    printf( "Cuts for node %d:\n", pObj->Id );
    Dar_ObjForEachCut( pObj, pCut, i )
        Dar_CutPrint( pCut );
//    printf( "\n" );
}